

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

void __thiscall duckdb_re2::DFA::~DFA(DFA *this)

{
  Workq *pWVar1;
  int *piVar2;
  
  pWVar1 = this->q0_;
  if (pWVar1 != (Workq *)0x0) {
    SparseSetT<void>::~SparseSetT(&pWVar1->super_SparseSet);
    operator_delete(pWVar1);
  }
  pWVar1 = this->q1_;
  if (pWVar1 != (Workq *)0x0) {
    SparseSetT<void>::~SparseSetT(&pWVar1->super_SparseSet);
    operator_delete(pWVar1);
  }
  ClearCache(this);
  std::
  _Hashtable<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>,_std::__detail::_Identity,_duckdb_re2::DFA::StateEqual,_duckdb_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->state_cache_)._M_h);
  pthread_rwlock_destroy((pthread_rwlock_t *)&this->cache_mutex_);
  piVar2 = (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
           _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar2 != (int *)0x0) {
    operator_delete(piVar2);
  }
  (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
  pthread_rwlock_destroy((pthread_rwlock_t *)&this->mutex_);
  return;
}

Assistant:

DFA::~DFA() {
  delete q0_;
  delete q1_;
  ClearCache();
}